

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_hostcheck.c
# Opt level: O0

int amqp_hostmatch(char *hostname,char *pattern)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t max;
  char *in_RSI;
  char *in_RDI;
  bool bVar6;
  size_t suffixlen;
  size_t prefixlen;
  int wildcard_enabled;
  char *hostname_label_end;
  char *pattern_wildcard;
  char *pattern_label_end;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint local_4;
  
  pcVar3 = strchr(in_RSI,0x2a);
  if (pcVar3 == (char *)0x0) {
    iVar1 = amqp_raw_equal(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_4 = (uint)(iVar1 != 0);
  }
  else {
    iVar1 = 1;
    pcVar4 = strchr(in_RSI,0x2e);
    if ((((pcVar4 == (char *)0x0) || (pcVar5 = strchr(pcVar4 + 1,0x2e), pcVar5 == (char *)0x0)) ||
        (pcVar4 < pcVar3)) ||
       (iVar2 = amqp_raw_nequal((char *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8),
       iVar2 != 0)) {
      iVar1 = 0;
    }
    if (iVar1 == 0) {
      iVar1 = amqp_raw_equal(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_4 = (uint)(iVar1 != 0);
    }
    else {
      pcVar5 = strchr(in_RDI,0x2e);
      if ((pcVar5 == (char *)0x0) ||
         (iVar2 = amqp_raw_equal(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), iVar2 == 0))
      {
        local_4 = 0;
      }
      else if ((long)pcVar5 - (long)in_RDI < (long)pcVar4 - (long)in_RSI) {
        local_4 = 0;
      }
      else {
        pcVar5 = pcVar3 + -(long)in_RSI;
        max = (long)pcVar4 - (long)(pcVar3 + 1);
        iVar2 = amqp_raw_nequal((char *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),pcVar5,max);
        bVar6 = false;
        if (iVar2 != 0) {
          iVar1 = amqp_raw_nequal((char *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),pcVar5,max);
          bVar6 = iVar1 != 0;
        }
        local_4 = (uint)bVar6;
      }
    }
  }
  return local_4;
}

Assistant:

static int
amqp_hostmatch(const char *hostname, const char *pattern)
{
  const char *pattern_label_end, *pattern_wildcard, *hostname_label_end;
  int wildcard_enabled;
  size_t prefixlen, suffixlen;
  pattern_wildcard = strchr(pattern, '*');
  if (pattern_wildcard == NULL) {
    return amqp_raw_equal(pattern, hostname) ? 1 : 0;
  }
  /* We require at least 2 dots in pattern to avoid too wide wildcard match. */
  wildcard_enabled = 1;
  pattern_label_end = strchr(pattern, '.');
  if (pattern_label_end == NULL ||
      strchr(pattern_label_end + 1, '.') == NULL ||
      pattern_wildcard > pattern_label_end ||
      amqp_raw_nequal(pattern, "xn--", 4)) {
    wildcard_enabled = 0;
  }
  if (!wildcard_enabled) {
    return amqp_raw_equal(pattern, hostname) ? 1 : 0;
  }
  hostname_label_end = strchr(hostname, '.');
  if (hostname_label_end == NULL ||
      !amqp_raw_equal(pattern_label_end, hostname_label_end)) {
    return 0;
  }
  /* The wildcard must match at least one character, so the left-most
   * label of the hostname is at least as large as the left-most label
   * of the pattern.
   */
  if (hostname_label_end - hostname < pattern_label_end - pattern) {
    return 0;
  }
  prefixlen = pattern_wildcard - pattern;
  suffixlen = pattern_label_end - (pattern_wildcard + 1);
  return amqp_raw_nequal(pattern, hostname, prefixlen) &&
    amqp_raw_nequal(pattern_wildcard + 1, hostname_label_end - suffixlen,
                    suffixlen) ? 1 : 0;
}